

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

array<pbrt::Point3<float>,_4> *
pbrt::CubicBezierControlPoints<pbrt::Point3<float>>
          (span<const_pbrt::Point3<float>_> cp,Float uMin,Float uMax)

{
  initializer_list<pbrt::Point3<float>_> v;
  array<pbrt::Point3<float>,_4> *in_RDX;
  array<pbrt::Point3<float>,_4> *in_RDI;
  undefined1 auVar5 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  float fVar6;
  Point3<float> PVar7;
  Float in_stack_0000002c;
  Float in_stack_00000030;
  Float in_stack_00000034;
  span<const_pbrt::Point3<float>_> in_stack_00000038;
  undefined8 uVar8;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 local_58;
  float local_50;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 local_34;
  float local_2c;
  undefined8 *local_28;
  undefined8 local_20;
  array<pbrt::Point3<float>,_4> *paStack_8;
  
  auVar5 = ZEXT856(0);
  paStack_8 = in_RDX;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>
                    (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
  local_50 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar5;
  local_58 = vmovlpd_avx(auVar1._0_16_);
  auVar5 = ZEXT856(0);
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>
                    (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
  fVar6 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  uVar8 = vmovlpd_avx(auVar2._0_16_);
  auVar5 = (undefined1  [56])0x0;
  local_4c = uVar8;
  local_44 = fVar6;
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>
                    (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
  local_38 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_40 = vmovlpd_avx(auVar3._0_16_);
  auVar5 = ZEXT856(0);
  PVar7 = BlossomCubicBezier<pbrt::Point3<float>>
                    (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
  local_2c = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_34 = vmovlpd_avx(auVar4._0_16_);
  local_28 = &local_58;
  local_20 = 4;
  v._M_len._0_4_ = fVar6;
  v._M_array = (iterator)uVar8;
  v._M_len._4_4_ = in_stack_ffffffffffffff74;
  pstd::array<pbrt::Point3<float>,_4>::array(paStack_8,v);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<P, 4> CubicBezierControlPoints(pstd::span<const P> cp,
                                                               Float uMin, Float uMax) {
    return {BlossomCubicBezier(cp, uMin, uMin, uMin),
            BlossomCubicBezier(cp, uMin, uMin, uMax),
            BlossomCubicBezier(cp, uMin, uMax, uMax),
            BlossomCubicBezier(cp, uMax, uMax, uMax)};
}